

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_intra_pred_chroma_horz_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  long lVar2;
  ulong uVar3;
  UWORD8 *pUVar4;
  long lVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined1 auVar13 [16];
  
  if (nt == 8) {
    lVar2 = (long)dst_strd;
    lVar5 = 0;
    do {
      auVar7 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x1f],pu1_ref[lVar5 * 2 + 0x1e])),
                       ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x1f],pu1_ref[lVar5 * 2 + 0x1e])),0);
      uVar6 = auVar7._0_4_;
      auVar7 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x1d],pu1_ref[lVar5 * 2 + 0x1c])),
                       ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x1d],pu1_ref[lVar5 * 2 + 0x1c])),0);
      uVar8 = auVar7._0_4_;
      auVar7 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x1b],pu1_ref[lVar5 * 2 + 0x1a])),
                       ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x1b],pu1_ref[lVar5 * 2 + 0x1a])),0);
      uVar10 = auVar7._0_4_;
      auVar7 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x19],pu1_ref[lVar5 * 2 + 0x18])),
                       ZEXT216(CONCAT11(pu1_ref[lVar5 * 2 + 0x19],pu1_ref[lVar5 * 2 + 0x18])),0);
      uVar12 = auVar7._0_4_;
      *(undefined4 *)pu1_dst = uVar6;
      *(undefined4 *)(pu1_dst + 4) = uVar6;
      *(undefined4 *)(pu1_dst + 8) = uVar6;
      *(undefined4 *)(pu1_dst + 0xc) = uVar6;
      pUVar4 = pu1_dst + lVar2;
      *(undefined4 *)pUVar4 = uVar8;
      *(undefined4 *)(pUVar4 + 4) = uVar8;
      *(undefined4 *)(pUVar4 + 8) = uVar8;
      *(undefined4 *)(pUVar4 + 0xc) = uVar8;
      pUVar4 = pu1_dst + lVar2 * 2;
      *(undefined4 *)pUVar4 = uVar10;
      *(undefined4 *)(pUVar4 + 4) = uVar10;
      *(undefined4 *)(pUVar4 + 8) = uVar10;
      *(undefined4 *)(pUVar4 + 0xc) = uVar10;
      pUVar4 = pu1_dst + lVar2 * 3;
      *(undefined4 *)pUVar4 = uVar12;
      *(undefined4 *)(pUVar4 + 4) = uVar12;
      *(undefined4 *)(pUVar4 + 8) = uVar12;
      *(undefined4 *)(pUVar4 + 0xc) = uVar12;
      lVar5 = lVar5 + -4;
      pu1_dst = pu1_dst + lVar2 * 4;
    } while (lVar5 == -4);
  }
  else {
    if (nt != 0x10) {
      lVar2 = (long)nt;
      auVar7 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -1],pu1_ref[lVar2 * 4 + -2])),
                       ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -1],pu1_ref[lVar2 * 4 + -2])),0);
      auVar9 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -3],pu1_ref[lVar2 * 4 + -4])),
                       ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -3],pu1_ref[lVar2 * 4 + -4])),0);
      auVar11 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -5],pu1_ref[lVar2 * 4 + -6])),
                        ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -5],pu1_ref[lVar2 * 4 + -6])),0);
      auVar13 = pshuflw(ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -7],pu1_ref[lVar2 * 4 + -8])),
                        ZEXT216(CONCAT11(pu1_ref[lVar2 * 4 + -7],pu1_ref[lVar2 * 4 + -8])),0);
      *(long *)pu1_dst = auVar7._0_8_;
      lVar2 = (long)dst_strd;
      *(long *)(pu1_dst + lVar2) = auVar9._0_8_;
      *(long *)(pu1_dst + lVar2 * 2) = auVar11._0_8_;
      *(long *)(pu1_dst + lVar2 * 3) = auVar13._0_8_;
      return;
    }
    lVar2 = (long)dst_strd;
    pUVar4 = pu1_ref + 0x3f;
    uVar3 = 0xfffffffffffffffc;
    do {
      auVar7 = pshuflw(ZEXT216(CONCAT11(*pUVar4,pUVar4[-1])),ZEXT216(CONCAT11(*pUVar4,pUVar4[-1])),0
                      );
      uVar6 = auVar7._0_4_;
      auVar7 = pshuflw(ZEXT216(*(ushort *)(pUVar4 + -3)),ZEXT216(*(ushort *)(pUVar4 + -3)),0);
      uVar8 = auVar7._0_4_;
      auVar7 = pshuflw(ZEXT216(*(ushort *)(pUVar4 + -5)),ZEXT216(*(ushort *)(pUVar4 + -5)),0);
      uVar10 = auVar7._0_4_;
      auVar7 = pshuflw(ZEXT216(*(ushort *)(pUVar4 + -7)),ZEXT216(*(ushort *)(pUVar4 + -7)),0);
      uVar12 = auVar7._0_4_;
      *(undefined4 *)pu1_dst = uVar6;
      *(undefined4 *)(pu1_dst + 4) = uVar6;
      *(undefined4 *)(pu1_dst + 8) = uVar6;
      *(undefined4 *)(pu1_dst + 0xc) = uVar6;
      *(undefined4 *)(pu1_dst + 0x10) = uVar6;
      *(undefined4 *)(pu1_dst + 0x14) = uVar6;
      *(undefined4 *)(pu1_dst + 0x18) = uVar6;
      *(undefined4 *)(pu1_dst + 0x1c) = uVar6;
      pUVar1 = pu1_dst + lVar2;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar2 + 0x10;
      *(undefined4 *)pUVar1 = uVar8;
      *(undefined4 *)(pUVar1 + 4) = uVar8;
      *(undefined4 *)(pUVar1 + 8) = uVar8;
      *(undefined4 *)(pUVar1 + 0xc) = uVar8;
      pUVar1 = pu1_dst + lVar2 * 2;
      *(undefined4 *)pUVar1 = uVar10;
      *(undefined4 *)(pUVar1 + 4) = uVar10;
      *(undefined4 *)(pUVar1 + 8) = uVar10;
      *(undefined4 *)(pUVar1 + 0xc) = uVar10;
      pUVar1 = pu1_dst + lVar2 * 2 + 0x10;
      *(undefined4 *)pUVar1 = uVar10;
      *(undefined4 *)(pUVar1 + 4) = uVar10;
      *(undefined4 *)(pUVar1 + 8) = uVar10;
      *(undefined4 *)(pUVar1 + 0xc) = uVar10;
      pUVar1 = pu1_dst + lVar2 * 3;
      *(undefined4 *)pUVar1 = uVar12;
      *(undefined4 *)(pUVar1 + 4) = uVar12;
      *(undefined4 *)(pUVar1 + 8) = uVar12;
      *(undefined4 *)(pUVar1 + 0xc) = uVar12;
      pUVar1 = pu1_dst + lVar2 * 3 + 0x10;
      *(undefined4 *)pUVar1 = uVar12;
      *(undefined4 *)(pUVar1 + 4) = uVar12;
      *(undefined4 *)(pUVar1 + 8) = uVar12;
      *(undefined4 *)(pUVar1 + 0xc) = uVar12;
      uVar3 = uVar3 + 4;
      pu1_dst = pu1_dst + lVar2 * 4;
      pUVar4 = pUVar4 + -8;
    } while (uVar3 < 0xc);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_horz_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{

    WORD32 row;
    __m128i temp1, temp2, temp3, temp4, temp5, temp6,  temp7, temp8;
    UNUSED(src_strd);
    UNUSED(mode);

    /* Replication to next rows*/

    if(nt == 8)
    {
        for(row = 0; row < nt; row += 4)
        {
            temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 0)]);
            temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 0)]);
            temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 1)]);
            temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 1)]);
            temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 2)]);
            temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 2)]);
            temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 3)]);
            temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 3)]);

            temp2 = _mm_unpacklo_epi8(temp1, temp2);
            temp4 = _mm_unpacklo_epi8(temp3, temp4);
            temp6 = _mm_unpacklo_epi8(temp5, temp6);
            temp8 = _mm_unpacklo_epi8(temp7, temp8);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), temp8);

        }
    }
    else if(nt == 16)
    {
        for(row = 0; row < nt; row += 4)
        {
            temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 0)]);
            temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 0)]);

            temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 1)]);
            temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 1)]);

            temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 2)]);
            temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 2)]);

            temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * (row + 3)]);
            temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * (row + 3)]);

            temp2 = _mm_unpacklo_epi8(temp1, temp2);
            temp4 = _mm_unpacklo_epi8(temp3, temp4);
            temp6 = _mm_unpacklo_epi8(temp5, temp6);
            temp8 = _mm_unpacklo_epi8(temp7, temp8);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd) + 0), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd) + 16), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 0), temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 16), temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 0), temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 16), temp6);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 0), temp8);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 16), temp8);


        }
    }
    else
    {
        temp1 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 0]);
        temp2 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 0]);

        temp3 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 1]);
        temp4 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 1]);

        temp5 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 2]);
        temp6 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 2]);

        temp7 = _mm_set1_epi8(pu1_ref[(4 * nt) - 2 - 2 * 3]);
        temp8 = _mm_set1_epi8(pu1_ref[(4 * nt) - 1 - 2 * 3]);

        temp2 = _mm_unpacklo_epi8(temp1, temp2);
        temp4 = _mm_unpacklo_epi8(temp3, temp4);
        temp6 = _mm_unpacklo_epi8(temp5, temp6);
        temp8 = _mm_unpacklo_epi8(temp7, temp8);

        _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), temp2);
        _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), temp4);
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), temp6);
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), temp8);
    }
}